

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_start(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  Curl_creader *pCVar3;
  CURLcode CVar4;
  CURLcode unaff_EBP;
  Curl_creader *pCVar5;
  
  if (((data->req).field_0xd1 & 0x80) != 0) {
    pCVar5 = (data->req).reader_stack;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client start, rewind readers");
    }
    for (; pCVar5 != (Curl_creader *)0x0; pCVar5 = pCVar5->next) {
      CVar4 = (*pCVar5->crt->rewind)(data,pCVar5);
      if (CVar4 != CURLE_OK) {
        Curl_failf(data,"rewind of client reader \'%s\' failed: %d",pCVar5->crt->name,(ulong)CVar4);
        unaff_EBP = CVar4;
        goto LAB_00153311;
      }
    }
    puVar1 = &(data->req).field_0xd1;
    *puVar1 = *puVar1 & 0x7f;
    pCVar3 = (data->req).reader_stack;
    while (pCVar3 != (Curl_creader *)0x0) {
      (data->req).reader_stack = pCVar3->next;
      (*pCVar3->crt->do_close)(data,pCVar3);
      (*Curl_cfree)(pCVar3);
      pCVar3 = (data->req).reader_stack;
    }
LAB_00153311:
    if (pCVar5 != (Curl_creader *)0x0) {
      return unaff_EBP;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_client_start(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    struct Curl_creader *r = data->req.reader_stack;
    CURLcode result = CURLE_OK;

    CURL_TRC_READ(data, "client start, rewind readers");
    while(r) {
      result = r->crt->rewind(data, r);
      if(result) {
        failf(data, "rewind of client reader '%s' failed: %d",
              r->crt->name, result);
        return result;
      }
      r = r->next;
    }
    data->req.rewind_read = FALSE;
    cl_reset_reader(data);
  }
  return CURLE_OK;
}